

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O0

Var __thiscall Js::LazyJSONString::TryParse(LazyJSONString *this)

{
  bool bVar1;
  JSONProperty **ppJVar2;
  Var result;
  LazyJSONString *this_local;
  
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JSONProperty__
                      ((WriteBarrierPtr *)&this->jsonContent);
  if (*ppJVar2 == (JSONProperty *)0x0) {
    this_local = (LazyJSONString *)0x0;
  }
  else {
    bVar1 = HasComplexGap(this);
    if (bVar1) {
      this_local = (LazyJSONString *)0x0;
    }
    else {
      ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JSONProperty__
                          ((WriteBarrierPtr *)&this->jsonContent);
      this_local = (LazyJSONString *)ReconstructVar(this,*ppJVar2);
    }
  }
  return this_local;
}

Assistant:

Var
LazyJSONString::TryParse() const
{
    // If we have thrown away our metadata, we won't be able to Parse
    if (this->jsonContent == nullptr)
    {
        return nullptr;
    }

    // If the gap is complex, this means that parse will be a non-trivial transformation,
    // so fall back to the real parse
    if (this->HasComplexGap())
    {
        return nullptr;
    }

    Var result = ReconstructVar(this->jsonContent);

    return result;
}